

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

void vkt::addFunctionCaseWithPrograms<vkt::pipeline::(anonymous_namespace)::CaseDef>
               (TestCaseGroup *group,string *name,string *desc,Function_conflict initPrograms,
               Function_conflict testFunc,CaseDef_conflict *arg0)

{
  TestContext *testCtx;
  TestNode *node;
  undefined1 local_90 [40];
  CaseDef_conflict local_68;
  CaseDef_conflict local_4c;
  
  testCtx = (group->super_TestNode).m_testCtx;
  pipeline::anon_unknown_0::CaseDef::CaseDef((CaseDef *)&local_68,(CaseDef_conflict *)testFunc);
  node = (TestNode *)operator_new(0xa0);
  pipeline::anon_unknown_0::CaseDef::CaseDef((CaseDef *)&local_4c,&local_68);
  local_90._0_8_ = initPrograms;
  pipeline::anon_unknown_0::CaseDef::CaseDef((CaseDef *)(local_90 + 8),&local_4c);
  TestCase::TestCase((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,name,desc);
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfcba0;
  node[1]._vptr_TestNode = (_func_int **)pipeline::anon_unknown_0::initPrograms;
  FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args::Args
            ((Args *)&node[1].m_testCtx,(Args_conflict *)local_90);
  tcu::TestNode::addChild(&group->super_TestNode,node);
  return;
}

Assistant:

void addFunctionCaseWithPrograms (tcu::TestCaseGroup*							group,
								  const std::string&							name,
								  const std::string&							desc,
								  typename FunctionPrograms1<Arg0>::Function	initPrograms,
								  typename FunctionInstance1<Arg0>::Function	testFunc,
								  Arg0											arg0)
{
	group->addChild(createFunctionCaseWithPrograms<Arg0>(group->getTestContext(), tcu::NODETYPE_SELF_VALIDATE, name, desc, initPrograms, testFunc, arg0));
}